

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_table_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  short sVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ulong uVar20;
  int iVar21;
  int iVar22;
  parasail_result_t *ppVar23;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar24;
  uint uVar25;
  __m128i *palVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  uint uVar36;
  undefined2 uVar37;
  int iVar38;
  long lVar39;
  uint uVar40;
  short sVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  short sVar46;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  ushort uVar47;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  undefined1 auVar48 [16];
  __m128i alVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined4 uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  short sVar74;
  short sVar81;
  short sVar82;
  short sVar83;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ushort uVar85;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  undefined1 auVar86 [16];
  ushort uVar93;
  int iVar94;
  int iVar96;
  int iVar97;
  int iVar98;
  undefined1 auVar95 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar101 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  ushort local_68;
  ushort uStack_66;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  undefined1 auVar78 [16];
  short sVar84;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_scan_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_table_scan_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_scan_profile_sse41_128_16_cold_6();
      }
      else {
        uVar36 = profile->s1Len;
        if ((int)uVar36 < 1) {
          parasail_nw_table_scan_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_scan_profile_sse41_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_table_scan_profile_sse41_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_nw_table_scan_profile_sse41_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_table_scan_profile_sse41_128_16_cold_1();
        }
        else {
          uVar40 = uVar36 - 1;
          uVar27 = (ulong)uVar36 + 7 >> 3;
          iVar32 = -open;
          iVar24 = ppVar4->min;
          iVar31 = -iVar24;
          if (iVar24 != iVar32 && SBORROW4(iVar24,iVar32) == iVar24 + open < 0) {
            iVar31 = open;
          }
          iVar21 = ppVar4->max;
          ppVar23 = parasail_result_new_table1((uint)((ulong)uVar36 + 7) & 0x7ffffff8,s2Len);
          if (ppVar23 != (parasail_result_t *)0x0) {
            iVar38 = (int)(uVar40 / uVar27);
            ppVar23->flag = ppVar23->flag | 0x8220401;
            ptr = parasail_memalign___m128i(0x10,uVar27);
            ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,uVar27);
            ptr_02 = parasail_memalign___m128i(0x10,uVar27);
            ptr_03 = parasail_memalign___m128i(0x10,uVar27);
            if (ptr_03 != (__m128i *)0x0 &&
                ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                (ptr_00 != (int16_t *)0x0 && ptr != (__m128i *)0x0))) {
              iVar22 = s2Len + -1;
              auVar44 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar42 = auVar44._0_4_;
              auVar44 = pshuflw(auVar44,ZEXT416((uint)gap),0);
              uVar43 = auVar44._0_4_;
              uVar36 = iVar31 - 0x7fff;
              auVar44 = pshuflw(ZEXT416(uVar36),ZEXT416(uVar36),0);
              auVar45._0_4_ = auVar44._0_4_;
              auVar45._4_4_ = auVar45._0_4_;
              auVar45._8_4_ = auVar45._0_4_;
              auVar45._12_4_ = auVar45._0_4_;
              auVar57 = ZEXT416(CONCAT22((short)((uint)iVar24 >> 0x10),0x7ffe - (short)iVar21));
              auVar57 = pshuflw(auVar57,auVar57,0);
              auVar64 = pshufb(ZEXT416((uint)-((int)uVar27 * gap)),_DAT_00906db0);
              auVar64 = paddsw(auVar64,ZEXT416(uVar36 & 0xffff));
              lVar30 = (long)iVar32;
              uVar33 = 0;
              do {
                lVar28 = 0;
                lVar35 = lVar30;
                do {
                  uVar37 = 0x8000;
                  if (-0x8000 < lVar35) {
                    uVar37 = (undefined2)lVar35;
                  }
                  *(undefined2 *)((long)&local_48 + lVar28 * 2) = uVar37;
                  lVar39 = lVar35 - (ulong)(uint)open;
                  if (lVar39 < -0x7fff) {
                    lVar39 = -0x8000;
                  }
                  *(short *)((long)&local_58 + lVar28 * 2) = (short)lVar39;
                  lVar28 = lVar28 + 1;
                  lVar35 = lVar35 - uVar27 * (uint)gap;
                } while (lVar28 != 8);
                ptr_02[uVar33][0] = local_48;
                ptr_02[uVar33][1] = lStack_40;
                ptr[uVar33][0] = local_58;
                ptr[uVar33][1] = lStack_50;
                uVar33 = uVar33 + 1;
                lVar30 = lVar30 - (ulong)(uint)gap;
              } while (uVar33 != uVar27);
              *ptr_00 = 0;
              auVar86 = _DAT_00906ca0;
              uVar33 = (ulong)(uint)s2Len;
              lVar30 = uVar33 - 1;
              auVar65._8_4_ = (int)lVar30;
              auVar65._0_8_ = lVar30;
              auVar65._12_4_ = (int)((ulong)lVar30 >> 0x20);
              auVar63._4_4_ = gap;
              auVar63._0_4_ = gap;
              auVar63._8_4_ = gap;
              auVar63._12_4_ = gap;
              iVar24 = -gap;
              iVar31 = 0;
              auVar65 = auVar65 ^ _DAT_00906ca0;
              auVar48 = pmovsxwd(ZEXT416((uint)gap),0x8000800080008000);
              uVar34 = 0;
              do {
                uVar56 = (undefined4)uVar34;
                auVar99._8_4_ = uVar56;
                auVar99._0_8_ = uVar34;
                auVar99._12_4_ = (int)(uVar34 >> 0x20);
                auVar58 = (auVar99 | _DAT_00903a90) ^ auVar86;
                lVar30 = auVar65._0_8_;
                auVar59._0_8_ = -(ulong)(lVar30 < auVar58._0_8_);
                lVar35 = auVar65._8_8_;
                auVar59._8_8_ = -(ulong)(lVar35 < auVar58._8_8_);
                auVar101 = pshuflw(in_XMM12,auVar59,0xe8);
                auVar58._8_4_ = 0xffffffff;
                auVar58._0_8_ = 0xffffffffffffffff;
                auVar58._12_4_ = 0xffffffff;
                auVar58 = packssdw(auVar101 ^ auVar58,auVar101 ^ auVar58);
                iVar94 = iVar32 - iVar31;
                iVar96 = iVar24 - open;
                iVar97 = iVar32 - (gap * 2 + iVar31);
                iVar98 = iVar32 - (gap * 3 + iVar31);
                iVar21 = auVar48._0_4_;
                iVar7 = auVar48._4_4_;
                iVar8 = auVar48._8_4_;
                iVar9 = auVar48._12_4_;
                if ((auVar58 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar34 + 1] =
                       (ushort)(iVar94 < iVar21) * auVar48._0_2_ |
                       (ushort)(iVar94 >= iVar21) * (short)iVar94;
                }
                auVar59 = packssdw(auVar59,auVar59);
                auVar101._8_4_ = 0xffffffff;
                auVar101._0_8_ = 0xffffffffffffffff;
                auVar101._12_4_ = 0xffffffff;
                auVar59 = packssdw(auVar59 ^ auVar101,auVar59 ^ auVar101);
                if ((auVar59 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  ptr_00[uVar34 + 2] =
                       (ushort)(iVar96 < iVar7) * auVar48._4_2_ |
                       (ushort)(iVar96 >= iVar7) * (short)iVar96;
                }
                auVar59 = (auVar99 | _DAT_00903a80) ^ auVar86;
                auVar60._0_8_ = -(ulong)(lVar30 < auVar59._0_8_);
                auVar60._8_8_ = -(ulong)(lVar35 < auVar59._8_8_);
                auVar58 = packssdw(auVar58,auVar60);
                auVar14._8_4_ = 0xffffffff;
                auVar14._0_8_ = 0xffffffffffffffff;
                auVar14._12_4_ = 0xffffffff;
                in_XMM12 = packssdw(auVar58 ^ auVar14,auVar58 ^ auVar14);
                if ((in_XMM12 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  ptr_00[uVar34 + 3] =
                       (ushort)(iVar97 < iVar8) * auVar48._8_2_ |
                       (ushort)(iVar97 >= iVar8) * (short)iVar97;
                }
                auVar58 = pshufhw(auVar60,auVar60,0x84);
                auVar15._8_4_ = 0xffffffff;
                auVar15._0_8_ = 0xffffffffffffffff;
                auVar15._12_4_ = 0xffffffff;
                auVar58 = packssdw(auVar58 ^ auVar15,auVar58 ^ auVar15);
                if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  ptr_00[uVar34 + 4] =
                       (ushort)(iVar98 < iVar9) * auVar48._12_2_ |
                       (ushort)(iVar98 >= iVar9) * (short)iVar98;
                }
                auVar95._4_4_ = uVar56;
                auVar95._0_4_ = uVar56;
                auVar95._8_4_ = uVar56;
                auVar95._12_4_ = uVar56;
                auVar59 = pmulld(auVar95 | _DAT_00904a90,auVar63);
                iVar94 = iVar32 - auVar59._0_4_;
                iVar96 = iVar32 - auVar59._4_4_;
                iVar97 = iVar32 - auVar59._8_4_;
                iVar98 = iVar32 - auVar59._12_4_;
                auVar58 = (auVar99 | _DAT_00903ad0) ^ auVar86;
                auVar61._0_8_ = -(ulong)(lVar30 < auVar58._0_8_);
                auVar61._8_8_ = -(ulong)(lVar35 < auVar58._8_8_);
                auVar58 = pshuflw(auVar59,auVar61,0xe8);
                auVar16._8_4_ = 0xffffffff;
                auVar16._0_8_ = 0xffffffffffffffff;
                auVar16._12_4_ = 0xffffffff;
                auVar58 = packssdw(auVar58 ^ auVar16,auVar58 ^ auVar16);
                if ((auVar58 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar34 + 5] =
                       (ushort)(iVar94 < iVar21) * auVar48._0_2_ |
                       (ushort)(iVar94 >= iVar21) * (short)iVar94;
                }
                auVar58 = packssdw(auVar61,auVar61);
                auVar17._8_4_ = 0xffffffff;
                auVar17._0_8_ = 0xffffffffffffffff;
                auVar17._12_4_ = 0xffffffff;
                auVar58 = packssdw(auVar58 ^ auVar17,auVar58 ^ auVar17);
                if ((auVar58 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  ptr_00[uVar34 + 6] =
                       (ushort)(iVar96 < iVar7) * auVar48._4_2_ |
                       (ushort)(iVar96 >= iVar7) * (short)iVar96;
                }
                auVar59 = (auVar99 | _DAT_00903ac0) ^ auVar86;
                auVar100._0_8_ = -(ulong)(lVar30 < auVar59._0_8_);
                auVar100._8_8_ = -(ulong)(lVar35 < auVar59._8_8_);
                auVar58 = packssdw(auVar58,auVar100);
                auVar18._8_4_ = 0xffffffff;
                auVar18._0_8_ = 0xffffffffffffffff;
                auVar18._12_4_ = 0xffffffff;
                auVar58 = packssdw(auVar58 ^ auVar18,auVar58 ^ auVar18);
                if ((auVar58 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  ptr_00[uVar34 + 7] =
                       (ushort)(iVar97 < iVar8) * auVar48._8_2_ |
                       (ushort)(iVar97 >= iVar8) * (short)iVar97;
                }
                auVar58 = pshufhw(auVar58,auVar100,0x84);
                auVar19._8_4_ = 0xffffffff;
                auVar19._0_8_ = 0xffffffffffffffff;
                auVar19._12_4_ = 0xffffffff;
                auVar58 = packssdw(auVar58 ^ auVar19,auVar58 ^ auVar19);
                if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  ptr_00[uVar34 + 8] =
                       (ushort)(iVar98 < iVar9) * auVar48._12_2_ |
                       (ushort)(iVar98 >= iVar9) * (short)iVar98;
                }
                uVar34 = uVar34 + 8;
                iVar24 = iVar24 + gap * -8;
                iVar31 = iVar31 + gap * 8;
              } while ((s2Len + 7U & 0xfffffff8) != uVar34);
              auVar86._4_4_ = uVar42;
              auVar86._0_4_ = uVar42;
              auVar86._8_4_ = uVar42;
              auVar86._12_4_ = uVar42;
              alVar49 = (__m128i)psubsw((undefined1  [16])0x0,auVar86);
              uVar25 = (int)uVar27 - 1;
              palVar26 = ptr_03 + uVar25;
              uVar34 = uVar27;
              do {
                *palVar26 = alVar49;
                auVar48._4_4_ = uVar43;
                auVar48._0_4_ = uVar43;
                auVar48._8_4_ = uVar43;
                auVar48._12_4_ = uVar43;
                alVar49 = (__m128i)psubsw((undefined1  [16])alVar49,auVar48);
                palVar26 = palVar26 + -1;
                iVar24 = (int)uVar34;
                uVar29 = iVar24 - 1;
                uVar34 = (ulong)uVar29;
              } while (uVar29 != 0 && 0 < iVar24);
              lVar35 = uVar27 * uVar33;
              lVar30 = 0;
              uVar34 = 0;
              local_68 = auVar57._0_2_;
              uStack_66 = auVar57._2_2_;
              auVar57 = auVar45;
              uVar66 = local_68;
              uVar67 = uStack_66;
              uVar68 = local_68;
              uVar69 = uStack_66;
              uVar70 = local_68;
              uVar71 = uStack_66;
              uVar72 = local_68;
              uVar73 = uStack_66;
              do {
                uVar20 = ptr_02[uVar25][0];
                auVar62._8_8_ = ptr_02[uVar25][1] << 0x10 | uVar20 >> 0x30;
                auVar62._0_8_ = uVar20 << 0x10 | (ulong)(ushort)ptr_00[uVar34];
                iVar24 = ppVar4->mapper[(byte)s2[uVar34]];
                auVar50 = psubsw(auVar45,(undefined1  [16])*ptr_03);
                lVar28 = 0;
                auVar86 = auVar45;
                do {
                  auVar48 = *(undefined1 (*) [16])((long)*ptr_02 + lVar28);
                  auVar63 = paddsw(auVar62,*(undefined1 (*) [16])
                                            ((long)pvVar3 + lVar28 + (long)iVar24 * uVar27 * 0x10));
                  auVar65 = paddsw(auVar50,*(undefined1 (*) [16])((long)*ptr_03 + lVar28));
                  auVar12._4_4_ = uVar43;
                  auVar12._0_4_ = uVar43;
                  auVar12._8_4_ = uVar43;
                  auVar12._12_4_ = uVar43;
                  auVar58 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar28),auVar12);
                  sVar41 = auVar65._0_2_;
                  sVar46 = auVar86._0_2_;
                  auVar75._0_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar65._2_2_;
                  sVar46 = auVar86._2_2_;
                  auVar75._2_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar65._4_2_;
                  sVar46 = auVar86._4_2_;
                  auVar75._4_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar65._6_2_;
                  sVar46 = auVar86._6_2_;
                  auVar75._6_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar65._8_2_;
                  sVar46 = auVar86._8_2_;
                  auVar75._8_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar65._10_2_;
                  sVar46 = auVar86._10_2_;
                  auVar75._10_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar65._12_2_;
                  sVar46 = auVar86._12_2_;
                  sVar84 = auVar86._14_2_;
                  auVar75._12_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar65._14_2_;
                  auVar75._14_2_ =
                       (ushort)(sVar84 < sVar41) * sVar41 | (ushort)(sVar84 >= sVar41) * sVar84;
                  auVar10._4_4_ = uVar42;
                  auVar10._0_4_ = uVar42;
                  auVar10._8_4_ = uVar42;
                  auVar10._12_4_ = uVar42;
                  auVar86 = psubsw(auVar48,auVar10);
                  sVar41 = auVar58._0_2_;
                  sVar46 = auVar86._0_2_;
                  uVar85 = (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar58._2_2_;
                  sVar46 = auVar86._2_2_;
                  uVar87 = (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar58._4_2_;
                  sVar46 = auVar86._4_2_;
                  uVar88 = (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar58._6_2_;
                  sVar46 = auVar86._6_2_;
                  uVar89 = (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar58._8_2_;
                  sVar46 = auVar86._8_2_;
                  uVar90 = (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar58._10_2_;
                  sVar46 = auVar86._10_2_;
                  uVar91 = (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar58._12_2_;
                  sVar46 = auVar86._12_2_;
                  sVar84 = auVar86._14_2_;
                  uVar92 = (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar58._14_2_;
                  uVar93 = (ushort)(sVar84 < sVar41) * sVar41 | (ushort)(sVar84 >= sVar41) * sVar84;
                  sVar41 = auVar63._0_2_;
                  uVar47 = (sVar41 < (short)uVar85) * uVar85 |
                           (ushort)(sVar41 >= (short)uVar85) * sVar41;
                  sVar41 = auVar63._2_2_;
                  uVar53 = (sVar41 < (short)uVar87) * uVar87 |
                           (ushort)(sVar41 >= (short)uVar87) * sVar41;
                  sVar41 = auVar63._4_2_;
                  uVar54 = (sVar41 < (short)uVar88) * uVar88 |
                           (ushort)(sVar41 >= (short)uVar88) * sVar41;
                  sVar41 = auVar63._6_2_;
                  uVar55 = (sVar41 < (short)uVar89) * uVar89 |
                           (ushort)(sVar41 >= (short)uVar89) * sVar41;
                  auVar50._0_8_ = CONCAT26(uVar55,CONCAT24(uVar54,CONCAT22(uVar53,uVar47)));
                  sVar41 = auVar63._8_2_;
                  auVar50._8_2_ =
                       (sVar41 < (short)uVar90) * uVar90 |
                       (ushort)(sVar41 >= (short)uVar90) * sVar41;
                  sVar41 = auVar63._10_2_;
                  auVar50._10_2_ =
                       (sVar41 < (short)uVar91) * uVar91 |
                       (ushort)(sVar41 >= (short)uVar91) * sVar41;
                  sVar41 = auVar63._12_2_;
                  sVar46 = auVar63._14_2_;
                  auVar50._12_2_ =
                       (sVar41 < (short)uVar92) * uVar92 |
                       (ushort)(sVar41 >= (short)uVar92) * sVar41;
                  auVar50._14_2_ =
                       (sVar46 < (short)uVar93) * uVar93 |
                       (ushort)(sVar46 >= (short)uVar93) * sVar46;
                  puVar1 = (ushort *)((long)*ptr + lVar28);
                  *puVar1 = uVar85;
                  puVar1[1] = uVar87;
                  puVar1[2] = uVar88;
                  puVar1[3] = uVar89;
                  puVar1[4] = uVar90;
                  puVar1[5] = uVar91;
                  puVar1[6] = uVar92;
                  puVar1[7] = uVar93;
                  *(undefined1 (*) [16])((long)*ptr_01 + lVar28) = auVar50;
                  lVar28 = lVar28 + 0x10;
                  auVar62 = auVar48;
                  auVar86 = auVar75;
                } while (uVar27 << 4 != lVar28);
                auVar51._8_8_ = auVar50._8_8_ << 0x10 | (ulong)uVar55;
                uVar85 = ptr_00[uVar34 + 1];
                auVar51._0_8_ = auVar50._0_8_ << 0x10 | (ulong)uVar85;
                uVar34 = uVar34 + 1;
                auVar86 = paddsw((undefined1  [16])*ptr_03,auVar51);
                sVar41 = auVar86._0_2_;
                auVar76._0_2_ =
                     (ushort)((short)auVar75._0_2_ < sVar41) * sVar41 |
                     ((short)auVar75._0_2_ >= sVar41) * auVar75._0_2_;
                sVar41 = auVar86._2_2_;
                auVar76._2_2_ =
                     (ushort)((short)auVar75._2_2_ < sVar41) * sVar41 |
                     ((short)auVar75._2_2_ >= sVar41) * auVar75._2_2_;
                sVar41 = auVar86._4_2_;
                auVar76._4_2_ =
                     (ushort)((short)auVar75._4_2_ < sVar41) * sVar41 |
                     ((short)auVar75._4_2_ >= sVar41) * auVar75._4_2_;
                sVar41 = auVar86._6_2_;
                auVar76._6_2_ =
                     (ushort)((short)auVar75._6_2_ < sVar41) * sVar41 |
                     ((short)auVar75._6_2_ >= sVar41) * auVar75._6_2_;
                sVar41 = auVar86._8_2_;
                auVar76._8_2_ =
                     (ushort)((short)auVar75._8_2_ < sVar41) * sVar41 |
                     ((short)auVar75._8_2_ >= sVar41) * auVar75._8_2_;
                sVar41 = auVar86._10_2_;
                auVar76._10_2_ =
                     (ushort)((short)auVar75._10_2_ < sVar41) * sVar41 |
                     ((short)auVar75._10_2_ >= sVar41) * auVar75._10_2_;
                sVar41 = auVar86._12_2_;
                auVar76._12_2_ =
                     (ushort)((short)auVar75._12_2_ < sVar41) * sVar41 |
                     ((short)auVar75._12_2_ >= sVar41) * auVar75._12_2_;
                sVar41 = auVar86._14_2_;
                auVar76._14_2_ =
                     (ushort)((short)auVar75._14_2_ < sVar41) * sVar41 |
                     ((short)auVar75._14_2_ >= sVar41) * auVar75._14_2_;
                iVar24 = 6;
                do {
                  auVar77._0_8_ = auVar76._0_8_ << 0x10;
                  auVar77._8_8_ = auVar76._8_8_ << 0x10 | auVar76._0_8_ >> 0x30;
                  auVar86 = paddsw(auVar77,auVar64);
                  sVar41 = auVar76._0_2_;
                  sVar74 = auVar86._0_2_;
                  sVar46 = auVar76._2_2_;
                  sVar81 = auVar86._2_2_;
                  sVar84 = auVar76._4_2_;
                  sVar82 = auVar86._4_2_;
                  sVar6 = auVar76._6_2_;
                  sVar83 = auVar86._6_2_;
                  uVar87 = (ushort)(sVar83 < sVar6) * sVar6 | (ushort)(sVar83 >= sVar6) * sVar83;
                  auVar78._0_8_ =
                       CONCAT26(uVar87,CONCAT24((ushort)(sVar82 < sVar84) * sVar84 |
                                                (ushort)(sVar82 >= sVar84) * sVar82,
                                                CONCAT22((ushort)(sVar81 < sVar46) * sVar46 |
                                                         (ushort)(sVar81 >= sVar46) * sVar81,
                                                         (ushort)(sVar74 < sVar41) * sVar41 |
                                                         (ushort)(sVar74 >= sVar41) * sVar74)));
                  sVar41 = auVar76._8_2_;
                  sVar46 = auVar86._8_2_;
                  auVar78._8_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar76._10_2_;
                  sVar46 = auVar86._10_2_;
                  auVar78._10_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar76._12_2_;
                  sVar46 = auVar86._12_2_;
                  sVar84 = auVar86._14_2_;
                  auVar78._12_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar76._14_2_;
                  auVar78._14_2_ =
                       (ushort)(sVar84 < sVar41) * sVar41 | (ushort)(sVar84 >= sVar41) * sVar84;
                  iVar24 = iVar24 + -1;
                  auVar76 = auVar78;
                } while (iVar24 != 0);
                auVar79._0_8_ = auVar78._0_8_ << 0x10;
                auVar79._8_8_ = auVar78._8_8_ << 0x10 | (ulong)uVar87;
                auVar80 = paddsw(auVar79,ZEXT416(uVar36 & 0xffff));
                sVar41 = auVar80._0_2_;
                auVar52._0_2_ =
                     (ushort)((short)uVar85 < sVar41) * sVar41 | ((short)uVar85 >= sVar41) * uVar85;
                sVar41 = auVar80._2_2_;
                auVar52._2_2_ =
                     (ushort)((short)uVar47 < sVar41) * sVar41 | ((short)uVar47 >= sVar41) * uVar47;
                sVar41 = auVar80._4_2_;
                auVar52._4_2_ =
                     (ushort)((short)uVar53 < sVar41) * sVar41 | ((short)uVar53 >= sVar41) * uVar53;
                sVar41 = auVar80._6_2_;
                auVar52._6_2_ =
                     (ushort)((short)uVar54 < sVar41) * sVar41 | ((short)uVar54 >= sVar41) * uVar54;
                sVar41 = auVar80._8_2_;
                auVar52._8_2_ =
                     (ushort)((short)uVar55 < sVar41) * sVar41 | ((short)uVar55 >= sVar41) * uVar55;
                sVar41 = auVar80._10_2_;
                auVar52._10_2_ =
                     (ushort)((short)auVar50._8_2_ < sVar41) * sVar41 |
                     ((short)auVar50._8_2_ >= sVar41) * auVar50._8_2_;
                sVar41 = auVar80._12_2_;
                auVar52._12_2_ =
                     (ushort)((short)auVar50._10_2_ < sVar41) * sVar41 |
                     ((short)auVar50._10_2_ >= sVar41) * auVar50._10_2_;
                sVar41 = auVar80._14_2_;
                auVar52._14_2_ =
                     (ushort)((short)auVar50._12_2_ < sVar41) * sVar41 |
                     ((short)auVar50._12_2_ >= sVar41) * auVar50._12_2_;
                lVar39 = 0;
                lVar28 = lVar30;
                auVar86 = auVar57;
                do {
                  auVar13._4_4_ = uVar43;
                  auVar13._0_4_ = uVar43;
                  auVar13._8_4_ = uVar43;
                  auVar13._12_4_ = uVar43;
                  auVar48 = psubsw(auVar80,auVar13);
                  auVar11._4_4_ = uVar42;
                  auVar11._0_4_ = uVar42;
                  auVar11._8_4_ = uVar42;
                  auVar11._12_4_ = uVar42;
                  auVar57 = psubsw(auVar52,auVar11);
                  sVar41 = auVar57._0_2_;
                  sVar46 = auVar48._0_2_;
                  auVar80._0_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar57._2_2_;
                  sVar46 = auVar48._2_2_;
                  auVar80._2_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar57._4_2_;
                  sVar46 = auVar48._4_2_;
                  auVar80._4_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar57._6_2_;
                  sVar46 = auVar48._6_2_;
                  auVar80._6_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar57._8_2_;
                  sVar46 = auVar48._8_2_;
                  auVar80._8_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar57._10_2_;
                  sVar46 = auVar48._10_2_;
                  auVar80._10_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar57._12_2_;
                  sVar46 = auVar48._12_2_;
                  sVar84 = auVar48._14_2_;
                  auVar80._12_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar57._14_2_;
                  auVar80._14_2_ =
                       (ushort)(sVar84 < sVar41) * sVar41 | (ushort)(sVar84 >= sVar41) * sVar84;
                  psVar2 = (short *)((long)*ptr_01 + lVar39);
                  sVar41 = *psVar2;
                  sVar46 = psVar2[1];
                  sVar84 = psVar2[2];
                  sVar6 = psVar2[3];
                  sVar74 = psVar2[4];
                  sVar81 = psVar2[5];
                  sVar82 = psVar2[6];
                  sVar83 = psVar2[7];
                  auVar52._0_2_ =
                       (sVar41 < (short)auVar80._0_2_) * auVar80._0_2_ |
                       (ushort)(sVar41 >= (short)auVar80._0_2_) * sVar41;
                  auVar52._2_2_ =
                       (sVar46 < (short)auVar80._2_2_) * auVar80._2_2_ |
                       (ushort)(sVar46 >= (short)auVar80._2_2_) * sVar46;
                  auVar52._4_2_ =
                       (sVar84 < (short)auVar80._4_2_) * auVar80._4_2_ |
                       (ushort)(sVar84 >= (short)auVar80._4_2_) * sVar84;
                  auVar52._6_2_ =
                       (sVar6 < (short)auVar80._6_2_) * auVar80._6_2_ |
                       (ushort)(sVar6 >= (short)auVar80._6_2_) * sVar6;
                  auVar52._8_2_ =
                       (sVar74 < (short)auVar80._8_2_) * auVar80._8_2_ |
                       (ushort)(sVar74 >= (short)auVar80._8_2_) * sVar74;
                  auVar52._10_2_ =
                       (sVar81 < (short)auVar80._10_2_) * auVar80._10_2_ |
                       (ushort)(sVar81 >= (short)auVar80._10_2_) * sVar81;
                  auVar52._12_2_ =
                       (sVar82 < (short)auVar80._12_2_) * auVar80._12_2_ |
                       (ushort)(sVar82 >= (short)auVar80._12_2_) * sVar82;
                  auVar52._14_2_ =
                       (sVar83 < (short)auVar80._14_2_) * auVar80._14_2_ |
                       (ushort)(sVar83 >= (short)auVar80._14_2_) * sVar83;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar39) = auVar52;
                  piVar5 = ((ppVar23->field_4).rowcols)->score_row;
                  *(int *)((long)piVar5 + lVar28) = (int)(short)auVar52._0_2_;
                  *(int *)((long)piVar5 + lVar35 * 4 + lVar28) = (int)(short)auVar52._2_2_;
                  *(int *)((long)piVar5 + lVar35 * 8 + lVar28) = (int)(short)auVar52._4_2_;
                  *(int *)((long)piVar5 + lVar35 * 0xc + lVar28) = (int)(short)auVar52._6_2_;
                  *(int *)((long)piVar5 + lVar35 * 0x10 + lVar28) = (int)(short)auVar52._8_2_;
                  *(int *)((long)piVar5 + lVar35 * 0x14 + lVar28) = (int)(short)auVar52._10_2_;
                  *(int *)((long)piVar5 + lVar35 * 0x18 + lVar28) = (int)(short)auVar52._12_2_;
                  *(int *)((long)piVar5 + lVar35 * 0x1c + lVar28) = (int)(short)auVar52._14_2_;
                  uVar66 = ((short)auVar52._0_2_ < (short)uVar66) * auVar52._0_2_ |
                           ((short)auVar52._0_2_ >= (short)uVar66) * uVar66;
                  uVar67 = ((short)auVar52._2_2_ < (short)uVar67) * auVar52._2_2_ |
                           ((short)auVar52._2_2_ >= (short)uVar67) * uVar67;
                  uVar68 = ((short)auVar52._4_2_ < (short)uVar68) * auVar52._4_2_ |
                           ((short)auVar52._4_2_ >= (short)uVar68) * uVar68;
                  uVar69 = ((short)auVar52._6_2_ < (short)uVar69) * auVar52._6_2_ |
                           ((short)auVar52._6_2_ >= (short)uVar69) * uVar69;
                  uVar70 = ((short)auVar52._8_2_ < (short)uVar70) * auVar52._8_2_ |
                           ((short)auVar52._8_2_ >= (short)uVar70) * uVar70;
                  uVar71 = ((short)auVar52._10_2_ < (short)uVar71) * auVar52._10_2_ |
                           ((short)auVar52._10_2_ >= (short)uVar71) * uVar71;
                  uVar72 = ((short)auVar52._12_2_ < (short)uVar72) * auVar52._12_2_ |
                           ((short)auVar52._12_2_ >= (short)uVar72) * uVar72;
                  uVar73 = ((short)auVar52._14_2_ < (short)uVar73) * auVar52._14_2_ |
                           ((short)auVar52._14_2_ >= (short)uVar73) * uVar73;
                  sVar41 = auVar86._0_2_;
                  auVar57._0_2_ =
                       (sVar41 < (short)auVar52._0_2_) * auVar52._0_2_ |
                       (ushort)(sVar41 >= (short)auVar52._0_2_) * sVar41;
                  sVar41 = auVar86._2_2_;
                  auVar57._2_2_ =
                       (sVar41 < (short)auVar52._2_2_) * auVar52._2_2_ |
                       (ushort)(sVar41 >= (short)auVar52._2_2_) * sVar41;
                  sVar41 = auVar86._4_2_;
                  auVar57._4_2_ =
                       (sVar41 < (short)auVar52._4_2_) * auVar52._4_2_ |
                       (ushort)(sVar41 >= (short)auVar52._4_2_) * sVar41;
                  sVar41 = auVar86._6_2_;
                  auVar57._6_2_ =
                       (sVar41 < (short)auVar52._6_2_) * auVar52._6_2_ |
                       (ushort)(sVar41 >= (short)auVar52._6_2_) * sVar41;
                  sVar41 = auVar86._8_2_;
                  auVar57._8_2_ =
                       (sVar41 < (short)auVar52._8_2_) * auVar52._8_2_ |
                       (ushort)(sVar41 >= (short)auVar52._8_2_) * sVar41;
                  sVar41 = auVar86._10_2_;
                  auVar57._10_2_ =
                       (sVar41 < (short)auVar52._10_2_) * auVar52._10_2_ |
                       (ushort)(sVar41 >= (short)auVar52._10_2_) * sVar41;
                  sVar41 = auVar86._12_2_;
                  sVar46 = auVar86._14_2_;
                  auVar57._12_2_ =
                       (sVar41 < (short)auVar52._12_2_) * auVar52._12_2_ |
                       (ushort)(sVar41 >= (short)auVar52._12_2_) * sVar41;
                  auVar57._14_2_ =
                       (sVar46 < (short)auVar52._14_2_) * auVar52._14_2_ |
                       (ushort)(sVar46 >= (short)auVar52._14_2_) * sVar46;
                  lVar39 = lVar39 + 0x10;
                  lVar28 = lVar28 + uVar33 * 4;
                  auVar86 = auVar57;
                } while (uVar27 << 4 != lVar39);
                lVar30 = lVar30 + 4;
              } while (uVar34 != uVar33);
              uVar33 = ptr_02[(ulong)uVar40 % uVar27][1];
              if (iVar38 < 7) {
                iVar24 = 0;
                uVar27 = ptr_02[(ulong)uVar40 % uVar27][0];
                do {
                  uVar33 = uVar33 << 0x10 | uVar27 >> 0x30;
                  iVar24 = iVar24 + 1;
                  uVar27 = uVar27 << 0x10;
                } while (iVar24 < 7 - iVar38);
              }
              sVar41 = auVar44._0_2_;
              auVar64._0_2_ = -(ushort)((short)uVar66 < sVar41);
              sVar46 = auVar44._2_2_;
              auVar64._2_2_ = -(ushort)((short)uVar67 < sVar46);
              auVar64._4_2_ = -(ushort)((short)uVar68 < sVar41);
              auVar64._6_2_ = -(ushort)((short)uVar69 < sVar46);
              auVar64._8_2_ = -(ushort)((short)uVar70 < sVar41);
              auVar64._10_2_ = -(ushort)((short)uVar71 < sVar46);
              auVar64._12_2_ = -(ushort)((short)uVar72 < sVar41);
              auVar64._14_2_ = -(ushort)((short)uVar73 < sVar46);
              auVar44._0_2_ = -(ushort)((short)local_68 < (short)auVar57._0_2_);
              auVar44._2_2_ = -(ushort)((short)uStack_66 < (short)auVar57._2_2_);
              auVar44._4_2_ = -(ushort)((short)local_68 < (short)auVar57._4_2_);
              auVar44._6_2_ = -(ushort)((short)uStack_66 < (short)auVar57._6_2_);
              auVar44._8_2_ = -(ushort)((short)local_68 < (short)auVar57._8_2_);
              auVar44._10_2_ = -(ushort)((short)uStack_66 < (short)auVar57._10_2_);
              auVar44._12_2_ = -(ushort)((short)local_68 < (short)auVar57._12_2_);
              auVar44._14_2_ = -(ushort)((short)uStack_66 < (short)auVar57._14_2_);
              auVar44 = auVar44 | auVar64;
              if ((((((((((((((((auVar44 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar44 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar44 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar44 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar44 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar44 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar44 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar44 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar44 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar44 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar44 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar44 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar44 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar44 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar44 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar44[0xf]) {
                sVar41 = (short)(uVar33 >> 0x30);
              }
              else {
                *(byte *)&ppVar23->flag = (byte)ppVar23->flag | 0x40;
                sVar41 = 0;
                iVar22 = 0;
                uVar40 = 0;
              }
              ppVar23->score = (int)sVar41;
              ppVar23->end_query = uVar40;
              ppVar23->end_ref = iVar22;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar23;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}